

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgShader.cpp
# Opt level: O3

void __thiscall
rsg::ShaderInput::ShaderInput(ShaderInput *this,Variable *variable,ConstValueRangeAccess valueRange)

{
  vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *this_00;
  pointer pSVar1;
  int iVar2;
  allocator_type local_3a;
  allocator_type local_39;
  vector<rsg::Scalar,_std::allocator<rsg::Scalar>_> *local_38;
  
  this->m_variable = variable;
  this_00 = &this->m_min;
  iVar2 = VariableType::getScalarSize(&variable->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(this_00,(long)iVar2,&local_39);
  local_38 = this_00;
  iVar2 = VariableType::getScalarSize(&variable->m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::vector(&this->m_max,(long)iVar2,&local_3a)
  ;
  pSVar1 = (this_00->super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = VariableType::getScalarSize(&variable->m_type);
  if (iVar2 != 0) {
    memmove(pSVar1,valueRange.m_min,(long)iVar2 << 2);
  }
  pSVar1 = (this->m_max).super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = VariableType::getScalarSize(&variable->m_type);
  if (iVar2 != 0) {
    memmove(pSVar1,valueRange.m_max,(long)iVar2 << 2);
  }
  return;
}

Assistant:

ShaderInput::ShaderInput (const Variable* variable, ConstValueRangeAccess valueRange)
	: m_variable	(variable)
	, m_min			(variable->getType().getScalarSize())
	, m_max			(variable->getType().getScalarSize())
{
	ValueAccess(variable->getType(), &m_min[0]) = valueRange.getMin().value();
	ValueAccess(variable->getType(), &m_max[0]) = valueRange.getMax().value();
}